

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3423::ComputeMassMatrix(ChElementShellANCF_3423 *this)

{
  ulong uVar1;
  pointer pLVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pdVar4;
  undefined1 auVar5 [16];
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [64];
  DstEvaluatorType dstEvaluator;
  ShellANCF_Mass myformula;
  SrcEvaluatorType srcEvaluator;
  ChMatrixNM<double,_24,_24> TempMassMatrix;
  mul_assign_op<double,_double> local_12d9;
  plainobjectbase_evaluator_data<double,_24> local_12d8;
  ChIntegrable3D<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> local_12d0;
  ChElementShellANCF_3423 *local_12c8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
  local_12c0;
  double local_12a0;
  undefined8 uStack_1298;
  SrcEvaluatorType local_1290;
  undefined1 local_1280 [128];
  undefined1 local_1200 [64];
  undefined1 local_11c0 [64];
  undefined1 local_1180 [64];
  undefined1 local_1140 [64];
  undefined1 local_1100 [64];
  undefined1 local_10c0 [64];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined1 local_1000 [64];
  undefined1 local_fc0 [64];
  undefined1 local_f80 [64];
  undefined1 local_f40 [64];
  
  memset(&this->m_MassMatrix,0,0x1200);
  if (this->m_numLayers != 0) {
    uVar7 = 0;
    do {
      pLVar2 = (this->m_layers).
               super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      peVar3 = pLVar2[uVar7].m_material.
               super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      this_00 = pLVar2[uVar7].m_material.
                super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_12a0 = peVar3->m_rho;
      uStack_1298 = 0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      local_12d0._vptr_ChIntegrable3D = (_func_int **)&PTR__ChIntegrable3D_00b5f548;
      local_12c8 = this;
      memset((Matrix<double,_24,_24,_1,_24,_24> *)local_1280,0,0x1200);
      pdVar4 = (this->m_GaussZ).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = uVar7 + 1;
      ChQuadrature::Integrate3D<Eigen::Matrix<double,24,24,1,24,24>>
                ((Matrix<double,_24,_24,_1,_24,_24> *)local_1280,&local_12d0,-1.0,1.0,-1.0,1.0,
                 pdVar4[uVar7],pdVar4[uVar7 + 1],2);
      auVar5._8_8_ = uStack_1298;
      auVar5._0_8_ = local_12a0;
      local_1290.m_functor.m_other = local_12a0;
      local_12c0.m_dst = (DstEvaluatorType *)&local_12d8;
      local_12c0.m_src = &local_1290;
      local_12c0.m_functor = &local_12d9;
      auVar8 = vbroadcastsd_avx512f(auVar5);
      local_1280._0_64_ = vmulpd_avx512f(auVar8,local_1280._0_64_);
      local_1280._64_64_ = vmulpd_avx512f(auVar8,local_1280._64_64_);
      local_1200 = vmulpd_avx512f(auVar8,local_1200);
      local_11c0 = vmulpd_avx512f(auVar8,local_11c0);
      local_1180 = vmulpd_avx512f(auVar8,local_1180);
      local_1140 = vmulpd_avx512f(auVar8,local_1140);
      local_1100 = vmulpd_avx512f(auVar8,local_1100);
      local_10c0 = vmulpd_avx512f(auVar8,local_10c0);
      local_1080 = vmulpd_avx512f(auVar8,local_1080);
      local_1040 = vmulpd_avx512f(auVar8,local_1040);
      local_1000 = vmulpd_avx512f(auVar8,local_1000);
      local_fc0 = vmulpd_avx512f(auVar8,local_fc0);
      local_f80 = vmulpd_avx512f(auVar8,local_f80);
      local_f40 = vmulpd_avx512f(auVar8,local_f40);
      local_12d8.data = (double *)local_1280;
      local_12c0.m_dstExpr = (Matrix<double,_24,_24,_1,_24,_24> *)local_1280;
      Eigen::internal::
      copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_112,_576>
      ::run(&local_12c0);
      lVar6 = 0;
      do {
        auVar8 = vaddpd_avx512f(*(undefined1 (*) [64])(local_1280 + lVar6),
                                *(undefined1 (*) [64])
                                 ((long)(this->m_MassMatrix).
                                        super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                        .m_storage.m_data.array + lVar6));
        *(undefined1 (*) [64])
         ((long)(this->m_MassMatrix).
                super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
                array + lVar6) = auVar8;
        auVar8 = vaddpd_avx512f(*(undefined1 (*) [64])(local_1280 + lVar6 + 0x40),
                                *(undefined1 (*) [64])
                                 ((long)(this->m_MassMatrix).
                                        super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                        .m_storage.m_data.array + lVar6 + 0x40));
        *(undefined1 (*) [64])
         ((long)(this->m_MassMatrix).
                super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
                array + lVar6 + 0x40) = auVar8;
        auVar8 = vaddpd_avx512f(*(undefined1 (*) [64])(local_1200 + lVar6),
                                *(undefined1 (*) [64])
                                 ((long)(this->m_MassMatrix).
                                        super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                        .m_storage.m_data.array + lVar6 + 0x80));
        *(undefined1 (*) [64])
         ((long)(this->m_MassMatrix).
                super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
                array + lVar6 + 0x80) = auVar8;
        lVar6 = lVar6 + 0xc0;
      } while (lVar6 != 0x1200);
      uVar7 = uVar1;
    } while (uVar1 < this->m_numLayers);
  }
  return;
}

Assistant:

void ChElementShellANCF_3423::ComputeMassMatrix() {
    m_MassMatrix.setZero();

    for (size_t kl = 0; kl < m_numLayers; kl++) {
        double rho = m_layers[kl].GetMaterial()->Get_rho();
        ShellANCF_Mass myformula(this);
        ChMatrixNM<double, 24, 24> TempMassMatrix;
        TempMassMatrix.setZero();
        ChQuadrature::Integrate3D<ChMatrixNM<double, 24, 24>>(TempMassMatrix,  // result of integration will go there
                                                              myformula,       // formula to integrate
                                                              -1, 1,           // x limits
                                                              -1, 1,           // y limits
                                                              m_GaussZ[kl], m_GaussZ[kl + 1],  // z limits
                                                              2                                // order of integration
        );
        TempMassMatrix *= rho;
        m_MassMatrix += TempMassMatrix;
    }
}